

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

void ptls_minicrypto_random_bytes(void *buf,size_t len)

{
  cf_hash_drbg_sha256 *ctx;
  uint32_t uVar1;
  uint __fd;
  ssize_t sVar2;
  int *piVar3;
  undefined8 *puVar4;
  char *pcVar5;
  size_t __nbytes;
  undefined8 *puVar6;
  long *in_FS_OFFSET;
  uint8_t entropy [256];
  undefined8 local_138 [16];
  undefined1 local_b8 [136];
  
  ctx = (cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74);
  uVar1 = cf_hash_drbg_sha256_needs_reseed(ctx);
  if (uVar1 != 0) {
    __fd = open("/dev/urandom",0x80000);
    if (__fd == 0xffffffff) {
      pcVar5 = "/dev/random";
      puVar4 = (undefined8 *)0x80000;
      __fd = open("/dev/random",0x80000);
      if (__fd == 0xffffffff) {
LAB_0010fac2:
        ptls_minicrypto_random_bytes_cold_2();
        puVar6 = (undefined8 *)malloc(0x60);
        if (puVar6 != (undefined8 *)0x0) {
          *puVar6 = pcVar5;
          puVar6[1] = puVar6 + 8;
          puVar6[2] = 0x20;
          puVar6[3] = x25519_on_exchange;
          ptls_minicrypto_random_bytes(puVar6 + 4,0x20);
          cf_curve25519_mul_base((uint8_t *)(puVar6 + 8),(uint8_t *)(puVar6 + 4));
          *puVar4 = puVar6;
        }
        return;
      }
    }
    __nbytes = 0x100;
    puVar6 = local_138;
LAB_0010fa35:
    do {
      pcVar5 = (char *)(ulong)__fd;
      puVar4 = puVar6;
      sVar2 = read(__fd,puVar6,__nbytes);
      if (sVar2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 == 4) goto LAB_0010fa35;
      }
      if (sVar2 < 0) {
        ptls_minicrypto_random_bytes_cold_1();
        goto LAB_0010fac2;
      }
      puVar6 = (undefined8 *)((long)puVar6 + sVar2);
      __nbytes = __nbytes - sVar2;
    } while (__nbytes != 0);
    close(__fd);
    cf_hash_drbg_sha256_init(ctx,local_138,0x80,local_b8,0x80,"ptls",4);
  }
  cf_hash_drbg_sha256_gen(ctx,buf,len);
  return;
}

Assistant:

void ptls_minicrypto_random_bytes(void *buf, size_t len)
{
#ifdef _WINDOWS
    static __declspec(thread) cf_hash_drbg_sha256 ctx;
#else
    static __thread cf_hash_drbg_sha256 ctx;
#endif

    if (cf_hash_drbg_sha256_needs_reseed(&ctx)) {
        uint8_t entropy[256];
        read_entropy(entropy, sizeof(entropy));
        cf_hash_drbg_sha256_init(&ctx, entropy, sizeof(entropy) / 2, entropy + sizeof(entropy) / 2, sizeof(entropy) / 2, "ptls", 4);
    }
    cf_hash_drbg_sha256_gen(&ctx, buf, len);
}